

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

string_type * __thiscall
toml::detail::serializer<toml::type_config>::operator()[abi_cxx11_
          (string_type *__return_storage_ptr__,serializer<toml::type_config> *this,
          offset_datetime_type *odt,offset_datetime_format_info *fmt,source_location *param_3)

{
  byte bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_00;
  detail local_200 [32];
  string_type local_1e0;
  enable_if_t<is_std_basic_string<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
  local_1c0;
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  toml::operator<<((ostream *)&oss,&odt->date);
  bVar1 = 0x20;
  if (fmt->delimiter != space) {
    bVar1 = (fmt->delimiter == lower_t) << 5 | 0x54;
  }
  std::operator<<((ostream *)&oss,bVar1);
  format_local_time_abi_cxx11_(&local_1e0,this,&odt->time,fmt->has_seconds,fmt->subsecond_precision)
  ;
  string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
            (&local_1c0,(detail *)&local_1e0,s);
  std::operator<<((ostream *)&oss,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  toml::operator<<((ostream *)&oss,&odt->offset);
  std::__cxx11::stringbuf::str();
  string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
            (__return_storage_ptr__,local_200,s_00);
  std::__cxx11::string::~string((string *)local_200);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  return __return_storage_ptr__;
}

Assistant:

string_type operator()(const offset_datetime_type& odt, const offset_datetime_format_info& fmt, const source_location&) // {{{
    {
        std::ostringstream oss;
        oss << odt.date;
        switch(fmt.delimiter)
        {
            case datetime_delimiter_kind::upper_T: { oss << 'T'; break; }
            case datetime_delimiter_kind::lower_t: { oss << 't'; break; }
            case datetime_delimiter_kind::space:   { oss << ' '; break; }
            default:                               { oss << 'T'; break; }
        }
        oss << string_conv<std::string>(this->format_local_time(odt.time, fmt.has_seconds, fmt.subsecond_precision));
        oss << odt.offset;
        return string_conv<string_type>(oss.str());
    }